

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void imguiSetAa(void)

{
  bool bVar1;
  exception *this;
  
  bVar1 = loadSceneFramebufferTexture();
  if (((bVar1) && (bVar1 = loadSceneFramebuffer(), bVar1)) && (bVar1 = loadViewerProgram(), bVar1))
  {
    g_framebuffer.flags.reset = true;
    return;
  }
  fprintf(_stdout,"=> Framebuffer config failed <=\n");
  fflush(_stdout);
  this = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this);
  __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void imguiSetAa()
{
    if (!loadSceneFramebufferTexture() || !loadSceneFramebuffer()
    || !loadViewerProgram()) {
        LOG("=> Framebuffer config failed <=\n");
        throw std::exception();
    }
    g_framebuffer.flags.reset = true;
}